

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_string
          (xml_buffered_writer *this,char_t *data)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  size_t extra;
  size_t length;
  size_t offset;
  char_t *data_local;
  xml_buffered_writer *this_local;
  
  length = this->bufsize;
  offset = (size_t)data;
  while (*(char *)offset != '\0' && length < 0x800) {
    this->buffer[length] = *(char_t *)offset;
    length = length + 1;
    offset = offset + 1;
  }
  if (length < 0x800) {
    this->bufsize = length;
  }
  else {
    sVar1 = length - this->bufsize;
    sVar2 = get_valid_length((char_t *)(offset - sVar1),sVar1);
    lVar3 = sVar1 - sVar2;
    this->bufsize = length - lVar3;
    sVar1 = strlength((char_t *)offset);
    write_direct(this,(char_t *)(offset - lVar3),sVar1 + lVar3);
  }
  return;
}

Assistant:

void write_string(const char_t* data)
		{
			// write the part of the string that fits in the buffer
			size_t offset = bufsize;

			while (*data && offset < bufcapacity)
				buffer[offset++] = *data++;

			// write the rest
			if (offset < bufcapacity)
			{
				bufsize = offset;
			}
			else
			{
				// backtrack a bit if we have split the codepoint
				size_t length = offset - bufsize;
				size_t extra = length - get_valid_length(data - length, length);

				bufsize = offset - extra;

				write_direct(data - extra, strlength(data) + extra);
			}
		}